

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void av1_tf_do_filtering_mt(AV1_COMP *cpi)

{
  AV1_COMP *in_RDI;
  AV1_COMP *unaff_retaddr;
  int num_workers;
  int is_highbitdepth;
  MultiThreadInfo *mt_info;
  AV1_COMMON *cm;
  int in_stack_000001a4;
  AV1_COMMON *in_stack_000001a8;
  MultiThreadInfo *in_stack_000001b0;
  int local_24;
  MultiThreadInfo *pMVar1;
  MultiThreadInfo *mt_info_00;
  
  mt_info_00 = (MultiThreadInfo *)&in_RDI->common;
  pMVar1 = &in_RDI->mt_info;
  if ((in_RDI->mt_info).num_mod_workers[1] < pMVar1->num_workers) {
    local_24 = (in_RDI->mt_info).num_mod_workers[1];
  }
  else {
    local_24 = pMVar1->num_workers;
  }
  prepare_tf_workers(unaff_retaddr,(AVxWorkerHook)in_RDI,(int)((ulong)mt_info_00 >> 0x20),
                     (int)mt_info_00);
  launch_workers(mt_info_00,(int)((ulong)pMVar1 >> 0x20));
  sync_enc_workers(in_stack_000001b0,in_stack_000001a8,in_stack_000001a4);
  tf_accumulate_frame_diff(in_RDI,local_24);
  tf_dealloc_thread_data(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  return;
}

Assistant:

void av1_tf_do_filtering_mt(AV1_COMP *cpi) {
  AV1_COMMON *cm = &cpi->common;
  MultiThreadInfo *mt_info = &cpi->mt_info;
  const int is_highbitdepth = cpi->tf_ctx.is_highbitdepth;

  int num_workers =
      AOMMIN(mt_info->num_mod_workers[MOD_TF], mt_info->num_workers);

  prepare_tf_workers(cpi, tf_worker_hook, num_workers, is_highbitdepth);
  launch_workers(mt_info, num_workers);
  sync_enc_workers(mt_info, cm, num_workers);
  tf_accumulate_frame_diff(cpi, num_workers);
  tf_dealloc_thread_data(cpi, num_workers, is_highbitdepth);
}